

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O0

void gather_sim_result<PredictionData<double,long>,InputData<double,long>,WorkerMemory<ImputedData<long,double>,double,double>>
               (vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_> *worker_memory,
               vector<WorkerMemory<ImputedData<long,_double>,_double,_double>,_std::allocator<WorkerMemory<ImputedData<long,_double>,_double,_double>_>_>
               *worker_memory_m,PredictionData<double,_long> *prediction_data,
               InputData<double,_long> *input_data,IsoForest *model_outputs,
               ExtIsoForest *model_outputs_ext,double *tmat,double *rmat,size_t n_from,size_t ntrees
               ,bool assume_full_distr,bool standardize_dist,bool as_kernel,int nthreads)

{
  bool bVar1;
  double *in_RCX;
  double *in_RDX;
  vector<WorkerMemory<ImputedData<long,_double>,_double,_double>,_std::allocator<WorkerMemory<ImputedData<long,_double>,_double,_double>_>_>
  *in_RSI;
  vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_> *in_RDI;
  long in_R8;
  long in_R9;
  undefined4 uVar2;
  undefined4 uVar5;
  double dVar3;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  undefined8 in_stack_00000020;
  byte in_stack_00000028;
  size_t ix_5;
  size_t ix_4;
  size_t ix_3;
  size_t ix_2;
  double div_trees;
  size_t ix_1;
  size_t ix;
  double ntrees_dbl;
  size_t n_to;
  size_t ncomb;
  size_t nrows;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff08;
  long local_f0;
  ulong local_e8;
  vector<double,_std::allocator<double>_> *this;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var9;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  double local_a8;
  ulong local_a0;
  ulong local_98;
  undefined1 auVar4 [16];
  
  if (!interrupt_switch) {
    if (in_RDX == (double *)0x0) {
      this = (vector<double,_std::allocator<double>_> *)in_RCX[6];
    }
    else {
      this = (vector<double,_std::allocator<double>_> *)in_RDX[2];
    }
    if (((ulong)this & 1) == 0) {
      local_e8 = ((ulong)this >> 1) *
                 (long)((long)&this[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 7);
    }
    else {
      local_e8 = (long)this *
                 ((ulong)((long)&this[-1].super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 7U) >> 1);
    }
    if (in_RDX == (double *)0x0) {
      local_f0 = 0;
    }
    else {
      local_f0 = (long)in_RDX[2] - in_stack_00000018;
    }
    if (in_RDI == (vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_> *)0x0) {
      _Var8._M_current = in_RCX;
      _Var9._M_current = in_RDX;
      std::
      vector<WorkerMemory<ImputedData<long,_double>,_double,_double>,_std::allocator<WorkerMemory<ImputedData<long,_double>,_double,_double>_>_>
      ::operator[](in_RSI,0);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff08);
      std::
      vector<WorkerMemory<ImputedData<long,_double>,_double,_double>,_std::allocator<WorkerMemory<ImputedData<long,_double>,_double,_double>_>_>
      ::operator[](in_RSI,0);
      std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff08);
      std::
      copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double*>
                (_Var9,_Var8,(double *)this);
    }
    else {
      _Var8._M_current = in_RCX;
      _Var9._M_current = in_RDX;
      std::vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>::operator[](in_RDI,0);
      bVar1 = std::vector<double,_std::allocator<double>_>::empty(this);
      if (bVar1) {
        std::vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>::operator[](in_RDI,0)
        ;
        std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff08);
        std::vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>::operator[](in_RDI,0)
        ;
        std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff08);
        std::
        copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double*>
                  (_Var9,_Var8,(double *)this);
      }
      else {
        std::vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>::operator[](in_RDI,0)
        ;
        std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff08);
        std::vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>::operator[](in_RDI,0)
        ;
        std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff08);
        std::
        copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double*>
                  (_Var9,_Var8,(double *)this);
      }
    }
    uVar5 = (undefined4)((ulong)in_stack_00000020 >> 0x20);
    auVar4._8_4_ = uVar5;
    auVar4._0_8_ = in_stack_00000020;
    auVar4._12_4_ = 0x45300000;
    uVar2 = (undefined4)in_stack_00000020;
    local_a8 = (auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,uVar2) - 4503599627370496.0);
    if (((byte)ix_5 & 1) == 0) {
      if (((byte)ix_4 & 1) == 0) {
        if (in_stack_00000008 == 0) {
          for (local_c8 = 0; local_c8 < (ulong)(in_stack_00000018 * local_f0);
              local_c8 = local_c8 + 1) {
            auVar7._8_4_ = uVar5;
            auVar7._0_8_ = in_stack_00000020;
            auVar7._12_4_ = 0x45300000;
            *(double *)(in_stack_00000010 + local_c8 * 8) =
                 (*(double *)(in_stack_00000010 + local_c8 * 8) +
                 (auVar7._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,uVar2) - 4503599627370496.0)) / local_a8;
          }
        }
        else {
          for (local_c0 = 0; local_c0 < local_e8; local_c0 = local_c0 + 1) {
            auVar6._8_4_ = uVar5;
            auVar6._0_8_ = in_stack_00000020;
            auVar6._12_4_ = 0x45300000;
            *(double *)(in_stack_00000008 + local_c0 * 8) =
                 (*(double *)(in_stack_00000008 + local_c0 * 8) +
                 (auVar6._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,uVar2) - 4503599627370496.0)) / local_a8;
          }
        }
      }
    }
    else if (((byte)ix_4 & 1) == 0) {
      if ((in_stack_00000028 & 1) == 0) {
        if (in_RCX == (double *)0x0) {
          if (in_R8 == 0) {
            dVar3 = expected_separation_depth_hotstart
                              (*(double *)(in_R9 + 0x30),*(size_t *)(in_R9 + 0x38),
                               *(long *)(in_R9 + 0x38) + (long)in_RDX[2]);
          }
          else {
            dVar3 = expected_separation_depth_hotstart
                              (*(double *)(in_R8 + 0x30),*(size_t *)(in_R8 + 0x38),
                               *(long *)(in_R8 + 0x38) + (long)in_RDX[2]);
          }
        }
        else {
          dVar3 = expected_separation_depth((size_t)in_stack_ffffffffffffff08);
        }
        local_a8 = (dVar3 - 1.0) * local_a8;
      }
      else {
        local_a8 = local_a8 * 2.0;
      }
      if (in_stack_00000008 == 0) {
        for (local_b8 = 0; local_b8 < (ulong)(in_stack_00000018 * local_f0); local_b8 = local_b8 + 1
            ) {
          dVar3 = exp2(-*(double *)(in_stack_00000010 + local_b8 * 8) / local_a8);
          *(double *)(in_stack_00000010 + local_b8 * 8) = dVar3;
        }
      }
      else {
        for (local_b0 = 0; local_b0 < local_e8; local_b0 = local_b0 + 1) {
          dVar3 = exp2(-*(double *)(in_stack_00000008 + local_b0 * 8) / local_a8);
          *(double *)(in_stack_00000008 + local_b0 * 8) = dVar3;
        }
      }
    }
    else if (in_stack_00000008 == 0) {
      for (local_a0 = 0; local_a0 < (ulong)(in_stack_00000018 * local_f0); local_a0 = local_a0 + 1)
      {
        *(double *)(in_stack_00000010 + local_a0 * 8) =
             *(double *)(in_stack_00000010 + local_a0 * 8) / local_a8;
      }
    }
    else {
      for (local_98 = 0; local_98 < local_e8; local_98 = local_98 + 1) {
        *(double *)(in_stack_00000008 + local_98 * 8) =
             *(double *)(in_stack_00000008 + local_98 * 8) / local_a8;
      }
    }
  }
  return;
}

Assistant:

void gather_sim_result(std::vector<WorkerForSimilarity> *worker_memory,
                       std::vector<WorkerMemory> *worker_memory_m,
                       PredictionData *prediction_data, InputData *input_data,
                       IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                       double *restrict tmat, double *restrict rmat, size_t n_from,
                       size_t ntrees, bool assume_full_distr,
                       bool standardize_dist, bool as_kernel, int nthreads)
{
    if (interrupt_switch)
        return;

    size_t nrows = (prediction_data != NULL)? prediction_data->nrows : input_data->nrows;
    size_t ncomb = calc_ncomb(nrows);
    size_t n_to  = (prediction_data != NULL)? (prediction_data->nrows - n_from) : 0;

    #ifdef _OPENMP
    if (nthreads > 1)
    {
        if (worker_memory != NULL)
        {
            for (WorkerForSimilarity &w : *worker_memory)
            {
                if (!w.tmat_sep.empty())
                {
                    #pragma omp parallel for schedule(static) num_threads(nthreads) shared(ncomb, tmat, w, worker_memory)
                    for (size_t_for ix = 0; ix < (decltype(ix))ncomb; ix++)
                        tmat[ix] += w.tmat_sep[ix];
                }
                else if (!w.rmat.empty())
                {
                    #pragma omp parallel for schedule(static) num_threads(nthreads) shared(rmat, w, worker_memory)
                    for (size_t_for ix = 0; ix < (decltype(ix))w.rmat.size(); ix++)
                        rmat[ix] += w.rmat[ix];
                }
            }
        }

        else
        {
            for (WorkerMemory &w : *worker_memory_m)
            {
                if (!w.tmat_sep.empty())
                {
                    #pragma omp parallel for schedule(static) num_threads(nthreads) shared(ncomb, tmat, w, worker_memory_m)
                    for (size_t_for ix = 0; ix < (decltype(ix))ncomb; ix++)
                        tmat[ix] += w.tmat_sep[ix];
                }
            }
        }
    }
    
    else
    #endif
    {
        if (worker_memory != NULL)
        {
            if (!(*worker_memory)[0].tmat_sep.empty())
                std::copy((*worker_memory)[0].tmat_sep.begin(), (*worker_memory)[0].tmat_sep.end(), tmat);
            else
                std::copy((*worker_memory)[0].rmat.begin(), (*worker_memory)[0].rmat.end(), rmat);
        }
        
        else
        {
            std::copy((*worker_memory_m)[0].tmat_sep.begin(), (*worker_memory_m)[0].tmat_sep.end(), tmat);
        }
    }

    double ntrees_dbl = (double) ntrees;
    if (standardize_dist)
    {
        if (as_kernel)
        {
            if (tmat != NULL)
                for (size_t ix = 0; ix < ncomb; ix++)
                    tmat[ix] /= ntrees_dbl;
            else
                for (size_t ix = 0; ix < (n_from * n_to); ix++)
                    rmat[ix] /= ntrees_dbl;
            return;
        }


        /* Note: the separation distances up this point are missing the first hop, which is always
           a +1 to every combination. Thus, it needs to be added back for the average separation depth.
           For the standardized metric, it takes the expected divisor as 2(=3-1) instead of 3, given
           that every combination will always get a +1 at the beginning. Since what's obtained here
           is a sum across all trees, adding this +1 means adding the number of trees. */
        double div_trees = ntrees_dbl;
        if (assume_full_distr)
        {
            div_trees *= 2;
        }

        else if (input_data != NULL)
        {
            div_trees *= (expected_separation_depth(input_data->nrows) - 1);
        }

        else
        {
            div_trees *= ((
                               (model_outputs != NULL)?
                                expected_separation_depth_hotstart(model_outputs->exp_avg_sep,
                                                                    model_outputs->orig_sample_size,
                                                                    model_outputs->orig_sample_size + prediction_data->nrows)
                                    :
                                expected_separation_depth_hotstart(model_outputs_ext->exp_avg_sep,
                                                                    model_outputs_ext->orig_sample_size,
                                                                    model_outputs_ext->orig_sample_size + prediction_data->nrows)
                          ) - 1);
        }

        
        if (tmat != NULL)
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t ix = 0; ix < ncomb; ix++)
                tmat[ix] = std::exp2( - tmat[ix] / div_trees);
        else
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t ix = 0; ix < (n_from * n_to); ix++)
                rmat[ix] = std::exp2( - rmat[ix] / div_trees);
    }
    
    else
    {
        if (as_kernel) return;

        if (tmat != NULL)
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t ix = 0; ix < ncomb; ix++)
                tmat[ix] = (tmat[ix] + ntrees) / ntrees_dbl;
        else
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t ix = 0; ix < (n_from * n_to); ix++)
                rmat[ix] = (rmat[ix] + ntrees) / ntrees_dbl;
    }
}